

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O0

lzma_ret stream_encoder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_filter *filters,
                            lzma_check check)

{
  code *pcVar1;
  lzma_index *plVar2;
  undefined1 local_100 [4];
  lzma_ret ret_;
  lzma_stream_flags stream_flags;
  undefined1 local_80 [8];
  undefined8 local_78;
  _func_void_ptr_void_ptr_size_t_size_t *local_38;
  lzma_stream_coder_conflict *coder;
  lzma_filter *plStack_28;
  lzma_check check_local;
  lzma_filter *filters_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  coder._4_4_ = check;
  plStack_28 = filters;
  filters_local = (lzma_filter *)allocator;
  allocator_local = (lzma_allocator *)next;
  if ((code *)next->init != stream_encoder_init) {
    lzma_next_end(next,allocator);
  }
  allocator_local->opaque = stream_encoder_init;
  if (plStack_28 == (lzma_filter *)0x0) {
    next_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    local_38 = allocator_local->alloc;
    if (local_38 == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) {
      local_38 = (_func_void_ptr_void_ptr_size_t_size_t *)
                 lzma_alloc(0x5d0,(lzma_allocator *)filters_local);
      if (local_38 == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) {
        return LZMA_MEM_ERROR;
      }
      allocator_local->alloc = local_38;
      allocator_local[1].alloc = stream_encode;
      allocator_local[1].free = stream_encoder_end;
      allocator_local[2].opaque = stream_encoder_update;
      *(undefined8 *)(local_38 + 0x120) = 0xffffffffffffffff;
      pcVar1 = local_38 + 8;
      memset(local_80,0,0x48);
      local_78 = 0xffffffffffffffff;
      memcpy(pcVar1,local_80,0x48);
      pcVar1 = local_38 + 0x170;
      memset(&stream_flags.reserved_int2,0,0x48);
      memcpy(pcVar1,&stream_flags.reserved_int2,0x48);
      *(undefined8 *)(local_38 + 0x1b8) = 0;
    }
    *(undefined4 *)local_38 = 0;
    *(undefined4 *)(local_38 + 0x50) = 0;
    *(lzma_check *)(local_38 + 0x58) = coder._4_4_;
    lzma_index_end(*(lzma_index **)(local_38 + 0x1b8),(lzma_allocator *)filters_local);
    plVar2 = lzma_index_init((lzma_allocator *)filters_local);
    *(lzma_index **)(local_38 + 0x1b8) = plVar2;
    if (*(long *)(local_38 + 0x1b8) == 0) {
      next_local._4_4_ = LZMA_MEM_ERROR;
    }
    else {
      memset(local_100,0,0x38);
      stream_flags.backward_size._0_4_ = coder._4_4_;
      next_local._4_4_ =
           lzma_stream_header_encode((lzma_stream_flags *)local_100,(uint8_t *)(local_38 + 0x1d0));
      if (next_local._4_4_ == LZMA_OK) {
        *(undefined8 *)(local_38 + 0x1c0) = 0;
        *(undefined8 *)(local_38 + 0x1c8) = 0xc;
        next_local._4_4_ =
             stream_encoder_update
                       (local_38,(lzma_allocator *)filters_local,plStack_28,(lzma_filter *)0x0);
      }
    }
  }
  return next_local._4_4_;
}

Assistant:

static lzma_ret
stream_encoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter *filters, lzma_check check)
{
	lzma_next_coder_init(&stream_encoder_init, next, allocator);

	if (filters == NULL)
		return LZMA_PROG_ERROR;

	lzma_stream_coder *coder = next->coder;

	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_stream_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &stream_encode;
		next->end = &stream_encoder_end;
		next->update = &stream_encoder_update;

		coder->filters[0].id = LZMA_VLI_UNKNOWN;
		coder->block_encoder = LZMA_NEXT_CODER_INIT;
		coder->index_encoder = LZMA_NEXT_CODER_INIT;
		coder->index = NULL;
	}

	// Basic initializations
	coder->sequence = SEQ_STREAM_HEADER;
	coder->block_options.version = 0;
	coder->block_options.check = check;

	// Initialize the Index
	lzma_index_end(coder->index, allocator);
	coder->index = lzma_index_init(allocator);
	if (coder->index == NULL)
		return LZMA_MEM_ERROR;

	// Encode the Stream Header
	lzma_stream_flags stream_flags = {
		.version = 0,
		.check = check,
	};
	return_if_error(lzma_stream_header_encode(
			&stream_flags, coder->buffer));

	coder->buffer_pos = 0;
	coder->buffer_size = LZMA_STREAM_HEADER_SIZE;

	// Initialize the Block encoder. This way we detect unsupported
	// filter chains when initializing the Stream encoder instead of
	// giving an error after Stream Header has already written out.
	return stream_encoder_update(coder, allocator, filters, NULL);
}